

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O0

maze_path * __thiscall
HBF::search(maze_path *__return_storage_ptr__,HBF *this,
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *grid,vector<double,_std::allocator<double>_> *start,
           vector<int,_std::allocator<int>_> *goal)

{
  allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_> *this_00;
  allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
  *this_01;
  allocator<int> *this_02;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_03;
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  *this_04;
  double float_num;
  double float_num_00;
  double dVar1;
  double float_num_01;
  double float_num_02;
  double theta_00;
  __type _Var2;
  __type _Var3;
  __type _Var4;
  double dVar5;
  maze_s state_00;
  initializer_list<HBF::maze_s> __l;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  iterator iVar19;
  iterator iVar20;
  reference pvVar21;
  ostream *poVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 local_2b0 [8];
  maze_s state2;
  int stack2;
  double theta2;
  double y2;
  double x2;
  double g2;
  double h;
  int i;
  undefined1 local_238 [8];
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> next_state;
  int y;
  int x;
  __normal_iterator<HBF::maze_s_*,_std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>
  local_208;
  const_iterator local_200;
  double dStack_1f8;
  maze_s next;
  allocator<HBF::maze_s> local_1b9;
  int length;
  bool finished;
  double dStack_1b0;
  double local_1a8;
  iterator local_198;
  size_type local_190;
  undefined1 local_188 [8];
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> opened;
  int total_closed;
  maze_s state;
  double g;
  int stack;
  double theta;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_128;
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  local_110;
  undefined1 local_f8 [8];
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  came_from;
  vector<int,_std::allocator<int>_> local_d8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c0;
  undefined1 local_a8 [8];
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  closed_value;
  allocator<HBF::maze_s> local_79;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_78;
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  local_60;
  undefined1 local_48 [8];
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  closed;
  vector<int,_std::allocator<int>_> *goal_local;
  vector<double,_std::allocator<double>_> *start_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid_local;
  HBF *this_local;
  maze_path *path;
  
  iVar7 = this->NUM_THETA_CELLS;
  closed.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)goal;
  pvVar10 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](grid,0);
  sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
  sVar12 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::size(grid);
  std::allocator<HBF::maze_s>::allocator(&local_79);
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector(&local_78,sVar12,&local_79);
  this_00 = (allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_> *)
            ((long)&closed_value.
                    super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>::allocator(this_00);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector(&local_60,sVar11,&local_78,this_00);
  this_01 = (allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
             *)((long)&closed_value.
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::
  allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
  ::allocator(this_01);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            *)local_48,(long)iVar7,&local_60,this_01);
  std::
  allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
                *)((long)&closed_value.
                          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector(&local_60);
  std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>::~allocator
            ((allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_> *)
             ((long)&closed_value.
                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~vector(&local_78);
  std::allocator<HBF::maze_s>::~allocator(&local_79);
  iVar7 = this->NUM_THETA_CELLS;
  pvVar10 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](grid,0);
  sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
  sVar12 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::size(grid);
  this_02 = (allocator<int> *)
            ((long)&came_from.
                    super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_02);
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,sVar12,this_02);
  this_03 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
            ((long)&came_from.
                    super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_03);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c0,sVar11,&local_d8,this_03);
  this_04 = (allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             *)((long)&came_from.
                       super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::allocator(this_04);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)local_a8,(long)iVar7,&local_c0,this_04);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)((long)&came_from.
                          super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c0);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&came_from.
                     super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&came_from.
                     super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar7 = this->NUM_THETA_CELLS;
  pvVar10 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](grid,0);
  sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
  sVar12 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::size(grid);
  std::allocator<HBF::maze_s>::allocator((allocator<HBF::maze_s> *)((long)&theta + 7));
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_128,sVar12,(allocator<HBF::maze_s> *)((long)&theta + 7));
  std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>::allocator
            ((allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_> *)
             ((long)&theta + 6));
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector(&local_110,sVar11,&local_128,
           (allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_> *)((long)&theta + 6))
  ;
  std::
  allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
               *)((long)&theta + 5));
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            *)local_f8,(long)iVar7,&local_110,
           (allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
            *)((long)&theta + 5));
  std::
  allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>
                *)((long)&theta + 5));
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector(&local_110);
  std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>::~allocator
            ((allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_> *)
             ((long)&theta + 6));
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~vector(&local_128);
  std::allocator<HBF::maze_s>::~allocator((allocator<HBF::maze_s> *)((long)&theta + 7));
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](start,2);
  iVar7 = theta_to_stack_number(this,*pvVar13);
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](start,0);
  float_num = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](start,1);
  float_num_00 = *pvVar13;
  pvVar14 = std::
            vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            ::operator[]((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                          *)local_48,(long)iVar7);
  iVar8 = idx(this,float_num);
  pvVar15 = std::
            vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            ::operator[](pvVar14,(long)iVar8);
  iVar8 = idx(this,float_num_00);
  pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[](pvVar15,(long)iVar8);
  pvVar16->y = float_num_00;
  pvVar16->theta = state.y;
  pvVar16->g = 0.0;
  pvVar16->x = float_num;
  pvVar17 = std::
            vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          *)local_a8,(long)iVar7);
  iVar8 = idx(this,float_num);
  pvVar10 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](pvVar17,(long)iVar8);
  iVar8 = idx(this,float_num_00);
  pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar8);
  *pvVar18 = 1;
  pvVar14 = std::
            vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            ::operator[]((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                          *)local_f8,(long)iVar7);
  iVar7 = idx(this,float_num);
  pvVar15 = std::
            vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            ::operator[](pvVar14,(long)iVar7);
  iVar7 = idx(this,float_num_00);
  pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[](pvVar15,(long)iVar7);
  pvVar16->y = float_num_00;
  pvVar16->theta = state.y;
  pvVar16->g = 0.0;
  pvVar16->x = float_num;
  opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  _length = 0.0;
  local_198 = (iterator)&length;
  local_190 = 1;
  dStack_1b0 = float_num;
  local_1a8 = float_num_00;
  std::allocator<HBF::maze_s>::allocator(&local_1b9);
  __l._M_len = local_190;
  __l._M_array = local_198;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188,__l,&local_1b9);
  std::allocator<HBF::maze_s>::~allocator(&local_1b9);
  do {
    bVar6 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::empty
                      ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188);
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      poVar22 = std::operator<<((ostream *)&std::cout,"no valid path.");
      std::ostream::operator<<(poVar22,std::endl<char,std::char_traits<char>>);
      maze_path::maze_path(__return_storage_ptr__);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&__return_storage_ptr__->closed,
                  (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                   *)local_48);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&__return_storage_ptr__->came_from,
                  (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                   *)local_f8);
      (__return_storage_ptr__->final).g = 0.0;
      (__return_storage_ptr__->final).x = float_num;
      (__return_storage_ptr__->final).y = float_num_00;
      (__return_storage_ptr__->final).theta = state.y;
LAB_00109fc1:
      next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~vector
                ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                 *)local_f8);
      std::
      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 *)local_a8);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::size
              ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188);
    iVar19 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::begin
                       ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188);
    iVar20 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::end
                       ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188);
    std::
    sort<__gnu_cxx::__normal_iterator<HBF::maze_s*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>,comparator>
              (iVar19._M_current,iVar20._M_current);
    pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                        ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188,0);
    dStack_1f8 = pvVar16->g;
    next.g = pvVar16->x;
    next.x = pvVar16->y;
    next.y = pvVar16->theta;
    local_208._M_current =
         (maze_s *)
         std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::begin
                   ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188);
    __gnu_cxx::
    __normal_iterator<HBF::maze_s_const*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>::
    __normal_iterator<HBF::maze_s*>
              ((__normal_iterator<HBF::maze_s_const*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>
                *)&local_200,&local_208);
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::erase
              ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188,local_200);
    iVar7 = (int)next.g;
    iVar8 = (int)next.x;
    iVar9 = idx(this,(double)iVar7);
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](goal,0);
    if (iVar9 == *pvVar18) {
      iVar9 = idx(this,(double)iVar8);
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](goal,1);
      if (iVar9 == *pvVar18) {
        poVar22 = std::operator<<((ostream *)&std::cout,"found path to goal in ");
        poVar22 = (ostream *)
                  std::ostream::operator<<
                            (poVar22,opened.
                                     super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        poVar22 = std::operator<<(poVar22," expansions");
        std::ostream::operator<<(poVar22,std::endl<char,std::char_traits<char>>);
        next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        maze_path::maze_path(__return_storage_ptr__);
        std::
        vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ::operator=(&__return_storage_ptr__->closed,
                    (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                     *)local_48);
        std::
        vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ::operator=(&__return_storage_ptr__->came_from,
                    (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                     *)local_f8);
        (__return_storage_ptr__->final).g = dStack_1f8;
        (__return_storage_ptr__->final).x = next.g;
        (__return_storage_ptr__->final).y = next.x;
        (__return_storage_ptr__->final).theta = next.y;
        next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        goto LAB_00109fc1;
      }
    }
    state_00.x = next.g;
    state_00.g = dStack_1f8;
    state_00.y = next.x;
    state_00.theta = next.y;
    expand((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238,this,state_00);
    for (h._4_4_ = 0;
        sVar11 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::size
                           ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238),
        (ulong)(long)h._4_4_ < sVar11; h._4_4_ = h._4_4_ + 1) {
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](goal,0);
      iVar9 = iVar7 - *pvVar18;
      if (iVar9 < 1) {
        iVar9 = -iVar9;
      }
      _Var2 = std::pow<int,int>(iVar9,2);
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](goal,1);
      iVar9 = iVar8 - *pvVar18;
      if (iVar9 < 1) {
        iVar9 = -iVar9;
      }
      _Var3 = std::pow<int,int>(iVar9,2);
      iVar9 = theta_to_stack_number(this,next.y);
      _Var4 = std::pow<int,int>(iVar9 / 0xf,2);
      dVar5 = sqrt(_Var2 + _Var3 + _Var4);
      pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                          ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238,
                           (long)h._4_4_);
      dVar1 = pvVar16->g;
      pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                          ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238,
                           (long)h._4_4_);
      float_num_01 = pvVar16->x;
      pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                          ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238,
                           (long)h._4_4_);
      float_num_02 = pvVar16->y;
      pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                          ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238,
                           (long)h._4_4_);
      theta_00 = pvVar16->theta;
      if (((0.0 <= float_num_01) &&
          (sVar11 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::size(grid), auVar23._8_4_ = (int)(sVar11 >> 0x20), auVar23._0_8_ = sVar11,
          auVar23._12_4_ = 0x45300000,
          float_num_01 <
          (auVar23._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0))) && (0.0 <= float_num_02)
         ) {
        pvVar10 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](grid,0);
        sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
        auVar24._8_4_ = (int)(sVar11 >> 0x20);
        auVar24._0_8_ = sVar11;
        auVar24._12_4_ = 0x45300000;
        if (float_num_02 <
            (auVar24._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) {
          state2.theta._4_4_ = theta_to_stack_number(this,theta_00);
          pvVar17 = std::
                    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                  *)local_a8,(long)state2.theta._4_4_);
          iVar9 = idx(this,float_num_01);
          pvVar10 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](pvVar17,(long)iVar9);
          iVar9 = idx(this,float_num_02);
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar9);
          if (*pvVar18 == 0) {
            iVar9 = idx(this,float_num_01);
            pvVar10 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](grid,(long)iVar9);
            iVar9 = idx(this,float_num_02);
            pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar9);
            if (*pvVar18 == 0) {
              local_2b0 = (undefined1  [8])(dVar1 + dVar5);
              state2.g = float_num_01;
              state2.x = float_num_02;
              state2.y = theta_00;
              std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::push_back
                        ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_188,
                         (value_type *)local_2b0);
              pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                                  ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238,
                                   (long)h._4_4_);
              pvVar14 = std::
                        vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ::operator[]((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                                      *)local_48,(long)state2.theta._4_4_);
              iVar9 = idx(this,float_num_01);
              pvVar15 = std::
                        vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                        ::operator[](pvVar14,(long)iVar9);
              iVar9 = idx(this,float_num_02);
              pvVar21 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                                  (pvVar15,(long)iVar9);
              pvVar21->g = pvVar16->g;
              pvVar21->x = pvVar16->x;
              pvVar21->y = pvVar16->y;
              pvVar21->theta = pvVar16->theta;
              pvVar17 = std::
                        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                      *)local_a8,(long)state2.theta._4_4_);
              iVar9 = idx(this,float_num_01);
              pvVar10 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](pvVar17,(long)iVar9);
              iVar9 = idx(this,float_num_02);
              pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar9);
              *pvVar18 = 1;
              pvVar14 = std::
                        vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ::operator[]((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                                      *)local_f8,(long)state2.theta._4_4_);
              iVar9 = idx(this,float_num_01);
              pvVar15 = std::
                        vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                        ::operator[](pvVar14,(long)iVar9);
              iVar9 = idx(this,float_num_02);
              pvVar16 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                                  (pvVar15,(long)iVar9);
              pvVar16->g = dStack_1f8;
              pvVar16->x = next.g;
              pvVar16->y = next.x;
              pvVar16->theta = next.y;
              opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
            }
          }
        }
      }
    }
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~vector
              ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_238);
  } while( true );
}

Assistant:

HBF::maze_path HBF::search(vector<vector<int> > grid, vector<double> start, vector<int> goal) {
    /*
    Working Implementation of breadth first search. Does NOT use a heuristic
    and as a result this is pretty inefficient. Try modifying this algorithm
    into hybrid A* by adding heuristics appropriately.
    */

    vector<vector<vector<maze_s> > > closed(NUM_THETA_CELLS,
                                            vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    vector<vector<vector<int> > > closed_value(NUM_THETA_CELLS,
                                               vector<vector<int>>(grid[0].size(), vector<int>(grid.size())));
    vector<vector<vector<maze_s> > > came_from(NUM_THETA_CELLS,
                                               vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    double theta = start[2];
    int stack = theta_to_stack_number(theta);
    double g = 0;

    maze_s state;
    state.g = g;
    state.x = start[0];
    state.y = start[1];

    closed[stack][idx(state.x)][idx(state.y)] = state;
    closed_value[stack][idx(state.x)][idx(state.y)] = 1;
    came_from[stack][idx(state.x)][idx(state.y)] = state;
    int total_closed = 1;
    vector<maze_s> opened = {state};
    bool finished = false;

    // add my heuristic function
    // If you have one h value per cell then multiple states in that cell will have the same g+h value,
    // making it difficult to determine which is the better state.

//    vector<vector<int> > heuristic = heuristic_basic(grid, start, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_euclidean(grid, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_manhattan(grid, goal);


    while (!opened.empty()) {

        int length = opened.size();
        sort(opened.begin(), opened.end(), comparator());


        maze_s next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next.x;
        int y = next.y;

        if (idx(x) == goal[0] && idx(y) == goal[1]) {
            cout << "found path to goal in " << total_closed << " expansions" << endl;
            maze_path path;
            path.closed = closed;
            path.came_from = came_from;
            path.final = next;
            return path;

        }
        vector<maze_s> next_state = expand(next);

        for (int i = 0; i < next_state.size(); i++) {
            double h;
//            h = heuristic[x][y];
            h = sqrt(pow(abs(x-goal[0]),2)+pow(abs(y-goal[1]),2)+pow(theta_to_stack_number(next.theta)/15,2));
//            h = 0;
            double g2 = next_state[i].g + h;
            double x2 = next_state[i].x;
            double y2 = next_state[i].y;
            double theta2 = next_state[i].theta;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }
            int stack2 = theta_to_stack_number(theta2);

            if (closed_value[stack2][idx(x2)][idx(y2)] == 0 && grid[idx(x2)][idx(y2)] == 0) {

                maze_s state2;
                state2.g = g2;
                state2.x = x2;
                state2.y = y2;
                state2.theta = theta2;

                opened.push_back(state2);

                closed[stack2][idx(x2)][idx(y2)] = next_state[i];
                closed_value[stack2][idx(x2)][idx(y2)] = 1;
                came_from[stack2][idx(x2)][idx(y2)] = next;
                total_closed += 1;
            }


        }

    }
    cout << "no valid path." << endl;
    HBF::maze_path path;
    path.closed = closed;
    path.came_from = came_from;
    path.final = state;
    return path;

}